

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::qualBoundViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *in_RDX;
  double *in_RSI;
  long *in_RDI;
  double viol;
  int col;
  VectorBase<double> solu;
  int in_stack_ffffffffffffff3c;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  VectorBase<double> *in_stack_ffffffffffffff50;
  double local_48;
  int local_40;
  undefined1 local_30 [24];
  double *local_18;
  double *local_10;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  *in_RSI = 0.0;
  *in_RDX = 0.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25313f);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff50,iVar2);
  (**(code **)(*in_RDI + 0x300))(in_RDI,local_30);
  for (local_40 = 0; iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25318b),
      local_40 < iVar2; local_40 = local_40 + 1) {
    local_48 = 0.0;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    dVar1 = *pdVar3;
    pdVar3 = SPxLPBase<double>::lower(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    if (*pdVar3 <= dVar1) {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c)
      ;
      dVar1 = *pdVar3;
      pdVar3 = SPxLPBase<double>::upper(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff3c);
        in_stack_ffffffffffffff40 = (SPxLPBase<double> *)*pdVar3;
        pdVar3 = SPxLPBase<double>::upper(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_48 = spxAbs<double>((double)in_stack_ffffffffffffff40 - *pdVar3);
      }
    }
    else {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c)
      ;
      dVar1 = *pdVar3;
      pdVar3 = SPxLPBase<double>::lower(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      local_48 = spxAbs<double>(dVar1 - *pdVar3);
    }
    if (*local_10 <= local_48 && local_48 != *local_10) {
      *local_10 = local_48;
    }
    *local_18 = local_48 + *local_18;
  }
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x2533ae);
  return;
}

Assistant:

void SPxSolverBase<R>::qualBoundViolation(
   R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int col = 0; col < this->nCols(); ++col)
   {
      assert(this->lower(col) <= this->upper(col) + 1e-9);

      R viol = 0.0;

      if(solu[col] < this->lower(col))
         viol = spxAbs(solu[col] - this->lower(col));
      else if(solu[col] > this->upper(col))
         viol = spxAbs(solu[col] - this->upper(col));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}